

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O1

void __thiscall
pbrt::KdTreeAggregate::KdTreeAggregate
          (KdTreeAggregate *this,
          vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *p,int isectCost,
          int traversalCost,Float emptyBonus,int maxPrims,int maxDepth)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [64];
  pointer pPVar7;
  _Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_> _Var8;
  void *pvVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  ulong uVar12;
  _Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_> _Var13;
  int *prims0;
  ulong uVar14;
  int *prims1;
  int *primNums;
  undefined4 in_register_0000008c;
  ulong uVar15;
  int i;
  long lVar16;
  ulong __n;
  PrimitiveHandle *prim;
  pointer pPVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar31 [16];
  unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_> edges [3];
  undefined8 uStack_70;
  vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_> primBounds;
  
  auVar11 = _edges;
  uStack_70._4_4_ = in_register_0000008c;
  uStack_70._0_4_ = maxDepth;
  this->isectCost = isectCost;
  this->traversalCost = traversalCost;
  this->maxPrims = maxPrims;
  this->emptyBonus = emptyBonus;
  pPVar17 = (p->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  (this->primitives).
  super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
  super__Vector_impl_data._M_start =
       (p->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
       _M_impl.super__Vector_impl_data._M_start;
  (this->primitives).
  super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = pPVar17;
  (this->primitives).
  super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (p->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (p->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  primBounds.super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>.
  _M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
  (p->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>)._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)primBounds.
                super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
  (p->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)primBounds.
                super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  (this->primitiveIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->primitiveIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)primBounds.
                super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
  (this->primitiveIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)primBounds.
                super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = 3.4028235e+38;
  (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = 3.4028235e+38;
  *(undefined8 *)&(this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = 0xff7fffff7f7fffff;
  auVar28._8_4_ = 0xff7fffff;
  auVar28._0_8_ = &DAT_ff7fffffff7fffff;
  auVar28._12_4_ = 0xff7fffff;
  uVar3 = vmovlps_avx(auVar28);
  (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)uVar3;
  (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)((ulong)uVar3 >> 0x20);
  this->nAllocedNodes = 0;
  this->nextFreeNode = 0;
  edges = auVar11._0_24_;
  if (maxDepth < 1) {
    auVar26._0_4_ =
         (float)((uint)LZCOUNT((long)(this->primitives).
                                     super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->primitives).
                                     super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) ^ 0x3f);
    auVar26._4_12_ = in_ZMM2._4_12_;
    auVar28 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3fa66666),0),auVar26,ZEXT416(0x41000000));
    auVar27._8_4_ = 0x3effffff;
    auVar27._0_8_ = 0x3effffff3effffff;
    auVar27._12_4_ = 0x3effffff;
    auVar18._8_4_ = 0x80000000;
    auVar18._0_8_ = 0x8000000080000000;
    auVar18._12_4_ = 0x80000000;
    auVar18 = vpternlogd_avx512vl(auVar27,auVar28,auVar18,0xf8);
    auVar28 = ZEXT416((uint)(auVar28._0_4_ + auVar18._0_4_));
    auVar28 = vroundss_avx(auVar28,auVar28,0xb);
    uStack_70._0_4_ = (int)auVar28._0_4_;
    edges = edges;
    uStack_70._4_4_ = 0;
  }
  primBounds.super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>::reserve
            (&primBounds,
             (long)(this->primitives).
                   super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->primitives).
                   super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  pPVar17 = (this->primitives).
            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pPVar7 = (this->primitives).
           super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pPVar17 != pPVar7) {
    do {
      PrimitiveHandle::Bounds((Bounds3f *)edges,pPVar17);
      auVar25._8_8_ = 0;
      auVar25._0_8_ =
           edges[0]._M_t.
           super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>._M_t.
           super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
           super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
      uVar1 = (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
      uVar4 = (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
      auVar29._4_4_ = uVar4;
      auVar29._0_4_ = uVar1;
      auVar29._8_8_ = 0;
      auVar26 = vminps_avx(auVar25,auVar29);
      uVar2 = (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
      uVar5 = (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
      auVar30._4_4_ = uVar5;
      auVar30._0_4_ = uVar2;
      auVar30._8_8_ = 0;
      auVar27 = vminss_avx(ZEXT416((uint)edges[1]._M_t.
                                         super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                                         .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>.
                                         _M_head_impl),
                           ZEXT416((uint)(this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z));
      auVar31._8_8_ = 0;
      auVar31._0_8_ = edges._12_8_;
      auVar28 = vmaxps_avx(auVar31,auVar30);
      auVar18 = vmaxss_avx(ZEXT416(edges[2]._M_t.
                                   super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                                   .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl.
                                   _4_4_),
                           ZEXT416((uint)(this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z));
      uVar3 = vmovlps_avx(auVar26);
      (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar3;
      (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
      (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = auVar27._0_4_;
      uVar3 = vmovlps_avx(auVar28);
      (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar3;
      (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
      (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = auVar18._0_4_;
      if (primBounds.
          super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          primBounds.
          super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<pbrt::Bounds3<float>,std::allocator<pbrt::Bounds3<float>>>::
        _M_realloc_insert<pbrt::Bounds3<float>const&>
                  ((vector<pbrt::Bounds3<float>,std::allocator<pbrt::Bounds3<float>>> *)&primBounds,
                   (iterator)
                   primBounds.
                   super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(Bounds3<float> *)edges);
      }
      else {
        *(__uniq_ptr_data<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>,_true,_true> *)
         &((primBounds.
            super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>._M_impl
            .super__Vector_impl_data._M_finish)->pMax).super_Tuple3<pbrt::Point3,_float>.y =
             edges[2]._M_t.
             super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>._M_t.
             super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
             super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
        *(__uniq_ptr_data<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>,_true,_true> *)
         &((primBounds.
            super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>._M_impl
            .super__Vector_impl_data._M_finish)->pMin).super_Tuple3<pbrt::Point3,_float> =
             edges[0]._M_t.
             super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>._M_t.
             super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
             super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
        *(__uniq_ptr_data<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>,_true,_true> *)
         &((primBounds.
            super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>._M_impl
            .super__Vector_impl_data._M_finish)->pMin).super_Tuple3<pbrt::Point3,_float>.z =
             edges[1]._M_t.
             super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>._M_t.
             super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
             super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
        primBounds.super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             primBounds.
             super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      pPVar17 = pPVar17 + 1;
    } while (pPVar17 != pPVar7);
  }
  _edges = vmovdqu64_avx512vl(ZEXT1632(ZEXT816(0) << 0x40));
  lVar16 = 0;
  do {
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         (long)(this->primitives).
               super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(this->primitives).
               super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
               _M_impl.super__Vector_impl_data._M_start >> 2;
    uVar12 = SUB168(auVar10 * ZEXT816(0xc),0);
    if (SUB168(auVar10 * ZEXT816(0xc),8) != 0) {
      uVar12 = 0xffffffffffffffff;
    }
    _Var13.super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl =
         (_Head_base<0UL,_pbrt::BoundEdge_*,_false>)operator_new__(uVar12);
    _Var8.super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl =
         edges[lVar16]._M_t.
         super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>._M_t.
         super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
         super__Head_base<0UL,_pbrt::BoundEdge_*,_false>;
    edges[lVar16]._M_t.
    super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>._M_t.
    super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
    super__Head_base<0UL,_pbrt::BoundEdge_*,_false> =
         _Var13.super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
    if (_Var8.super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl != (BoundEdge *)0x0) {
      operator_delete__((void *)_Var8.super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl);
    }
    lVar16 = lVar16 + 1;
  } while (lVar16 != 3);
  pPVar17 = (this->primitives).
            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pPVar7 = (this->primitives).
           super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl
           .super__Vector_impl_data._M_finish;
  lVar16 = (long)pPVar7 - (long)pPVar17;
  uVar15 = lVar16 >> 3;
  __n = -(ulong)(uVar15 >> 0x3e != 0) | lVar16 >> 1;
  prims0 = (int *)operator_new__(__n);
  memset(prims0,0,__n);
  uVar14 = (long)((int)edges[3]._M_t.
                       super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                       .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl + 1) * uVar15;
  uVar12 = 0xffffffffffffffff;
  if (uVar14 < 0x4000000000000000) {
    uVar12 = uVar14 * 4;
  }
  prims1 = (int *)operator_new__(uVar12);
  memset(prims1,0,uVar12);
  primNums = (int *)operator_new__(__n);
  memset(primNums,0,__n);
  if (pPVar7 != pPVar17) {
    auVar19 = vpbroadcastq_avx512f();
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar22 = vpmovsxbd_avx512f(_DAT_00583a30);
    uVar12 = 0;
    auVar23 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar24 = vpbroadcastd_avx512f(ZEXT416(0x10));
    do {
      vpcmpuq_avx512f(auVar21,auVar19,2);
      vpcmpuq_avx512f(auVar20,auVar19,2);
      auVar6 = vmovdqu32_avx512f(auVar22);
      *(undefined1 (*) [64])(primNums + uVar12) = auVar6;
      uVar12 = uVar12 + 0x10;
      auVar21 = vpaddq_avx512f(auVar21,auVar23);
      auVar20 = vpaddq_avx512f(auVar20,auVar23);
      auVar22 = vpaddd_avx512f(auVar22,auVar24);
    } while ((uVar15 + (uVar15 == 0) + 0xf & 0xfffffffffffffff0) != uVar12);
  }
  buildTree(this,0,&this->bounds,&primBounds,primNums,(int)uVar15,
            (int)edges[3]._M_t.
                 super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
                 super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl,edges,prims0,prims1,0)
  ;
  operator_delete__(primNums);
  operator_delete__(prims1);
  operator_delete__(prims0);
  lVar16 = 0x10;
  do {
    pvVar9 = *(void **)((long)&edges[0]._M_t.
                               super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                               .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl +
                       lVar16);
    if (pvVar9 != (void *)0x0) {
      operator_delete__(pvVar9);
    }
    *(undefined8 *)
     ((long)&edges[0]._M_t.
             super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>._M_t.
             super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
             super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl + lVar16) = 0;
    lVar16 = lVar16 + -8;
  } while (lVar16 != -8);
  if (primBounds.super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(primBounds.
                    super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)primBounds.
                          super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)primBounds.
                          super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

KdTreeAggregate::KdTreeAggregate(std::vector<PrimitiveHandle> p, int isectCost,
                                 int traversalCost, Float emptyBonus, int maxPrims,
                                 int maxDepth)
    : isectCost(isectCost),
      traversalCost(traversalCost),
      maxPrims(maxPrims),
      emptyBonus(emptyBonus),
      primitives(std::move(p)) {
    // Build kd-tree for accelerator
    nextFreeNode = nAllocedNodes = 0;
    if (maxDepth <= 0)
        maxDepth = std::round(8 + 1.3f * Log2Int(int64_t(primitives.size())));
    // Compute bounds for kd-tree construction
    std::vector<Bounds3f> primBounds;
    primBounds.reserve(primitives.size());
    for (PrimitiveHandle &prim : primitives) {
        Bounds3f b = prim.Bounds();
        bounds = Union(bounds, b);
        primBounds.push_back(b);
    }

    // Allocate working memory for kd-tree construction
    std::unique_ptr<BoundEdge[]> edges[3];
    for (int i = 0; i < 3; ++i)
        edges[i] = std::make_unique<BoundEdge[]>(2 * primitives.size());

    std::unique_ptr<int[]> prims0 = std::make_unique<int[]>(primitives.size());
    std::unique_ptr<int[]> prims1 =
        std::make_unique<int[]>((maxDepth + 1) * primitives.size());

    // Initialize _primNums_ for kd-tree construction
    std::unique_ptr<int[]> primNums = std::make_unique<int[]>(primitives.size());
    for (size_t i = 0; i < primitives.size(); ++i)
        primNums[i] = i;

    // Start recursive construction of kd-tree
    buildTree(0, bounds, primBounds, primNums.get(), primitives.size(), maxDepth, edges,
              prims0.get(), prims1.get(), 0);
}